

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterSort(SortSubtask *pTask,SorterList *pList)

{
  SorterCompare p_Var1;
  SorterRecord *local_248;
  SorterRecord *local_240;
  SorterRecord *pNext;
  SorterRecord *aSlot [64];
  SorterRecord *pSStack_30;
  int rc;
  SorterRecord *p;
  int i;
  SorterList *pList_local;
  SortSubtask *pTask_local;
  
  aSlot[0x3f]._4_4_ = vdbeSortAllocUnpacked(pTask);
  pTask_local._4_4_ = aSlot[0x3f]._4_4_;
  if (aSlot[0x3f]._4_4_ == 0) {
    pSStack_30 = pList->pList;
    p_Var1 = vdbeSorterGetCompare(pTask->pSorter);
    pTask->xCompare = p_Var1;
    memset(&pNext,0,0x200);
    while (pSStack_30 != (SorterRecord *)0x0) {
      if (pList->aMemory == (u8 *)0x0) {
        local_240 = (pSStack_30->u).pNext;
      }
      else if (pSStack_30 == (SorterRecord *)pList->aMemory) {
        local_240 = (SorterRecord *)0x0;
      }
      else {
        local_240 = (SorterRecord *)(pList->aMemory + (pSStack_30->u).iNext);
      }
      (pSStack_30->u).pNext = (SorterRecord *)0x0;
      p._4_4_ = 0;
      while (aSlot[(long)p._4_4_ + -1] != (SorterRecord *)0x0) {
        pSStack_30 = vdbeSorterMerge(pTask,pSStack_30,aSlot[(long)p._4_4_ + -1]);
        aSlot[(long)p._4_4_ + -1] = (SorterRecord *)0x0;
        p._4_4_ = p._4_4_ + 1;
      }
      aSlot[(long)p._4_4_ + -1] = pSStack_30;
      pSStack_30 = local_240;
    }
    pSStack_30 = (SorterRecord *)0x0;
    for (p._4_4_ = 0; p._4_4_ < 0x40; p._4_4_ = p._4_4_ + 1) {
      if (aSlot[(long)p._4_4_ + -1] != (SorterRecord *)0x0) {
        if (pSStack_30 == (SorterRecord *)0x0) {
          local_248 = aSlot[(long)p._4_4_ + -1];
        }
        else {
          local_248 = vdbeSorterMerge(pTask,pSStack_30,aSlot[(long)p._4_4_ + -1]);
        }
        pSStack_30 = local_248;
      }
    }
    pList->pList = pSStack_30;
    pTask_local._4_4_ = (uint)pTask->pUnpacked->errCode;
  }
  return pTask_local._4_4_;
}

Assistant:

static int vdbeSorterSort(SortSubtask *pTask, SorterList *pList){
  int i;
  SorterRecord *p;
  int rc;
  SorterRecord *aSlot[64];

  rc = vdbeSortAllocUnpacked(pTask);
  if( rc!=SQLITE_OK ) return rc;

  p = pList->pList;
  pTask->xCompare = vdbeSorterGetCompare(pTask->pSorter);
  memset(aSlot, 0, sizeof(aSlot));

  while( p ){
    SorterRecord *pNext;
    if( pList->aMemory ){
      if( (u8*)p==pList->aMemory ){
        pNext = 0;
      }else{
        assert( p->u.iNext<sqlite3MallocSize(pList->aMemory) );
        pNext = (SorterRecord*)&pList->aMemory[p->u.iNext];
      }
    }else{
      pNext = p->u.pNext;
    }

    p->u.pNext = 0;
    for(i=0; aSlot[i]; i++){
      p = vdbeSorterMerge(pTask, p, aSlot[i]);
      aSlot[i] = 0;
    }
    aSlot[i] = p;
    p = pNext;
  }

  p = 0;
  for(i=0; i<ArraySize(aSlot); i++){
    if( aSlot[i]==0 ) continue;
    p = p ? vdbeSorterMerge(pTask, p, aSlot[i]) : aSlot[i];
  }
  pList->pList = p;

  assert( pTask->pUnpacked->errCode==SQLITE_OK
       || pTask->pUnpacked->errCode==SQLITE_NOMEM
  );
  return pTask->pUnpacked->errCode;
}